

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::SscReader::DoClose(SscReader *this,int transportIndex)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  ScopedTimer __var292;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (DoClose(int)::__var92 == '\0') {
    iVar2 = __cxa_guard_acquire(&DoClose(int)::__var92);
    if (iVar2 != 0) {
      uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscReader.cpp"
                                  ,
                                  "virtual void adios2::core::engine::SscReader::DoClose(const int)"
                                  ,0x5c);
      DoClose::__var92 = (void *)ps_timer_create_(uVar4);
      __cxa_guard_release(&DoClose(int)::__var92);
    }
  }
  __var292.m_timer = DoClose::__var92;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Engine","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"SscReader","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Close","");
  iVar2 = 0;
  if (9 < this->m_Verbosity) {
    iVar2 = adios2::helper::Comm::Rank();
  }
  iVar3 = adios2::helper::Comm::Rank();
  adios2::helper::Log((string *)local_50,(string *)local_70,(string *)local_90,
                      (string *)&this->field_0x30,iVar2,iVar3,5,this->m_Verbosity,INFO);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  peVar1 = (this->m_EngineInstance).
           super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_SscReaderBase[6])(peVar1,transportIndex);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var292);
  return;
}

Assistant:

void SscReader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    helper::Log("Engine", "SscReader", "Close", m_Name, m_Verbosity >= 10 ? m_Comm.Rank() : 0,
                m_Comm.Rank(), 5, m_Verbosity, helper::LogMode::INFO);

    m_EngineInstance->Close(transportIndex);
}